

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxIn
          (ConfidentialTransaction *this,Txid *txid,uint32_t index,uint32_t sequence,
          Script *unlocking_script)

{
  wally_tx *tx;
  pointer pCVar1;
  pointer pCVar2;
  Txid *txid_00;
  bool bVar3;
  CfdException *pCVar4;
  uint index_00;
  int ret;
  size_t is_coinbase;
  ConfidentialTxIn txin;
  int local_33c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_338;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_318;
  Txid *local_300;
  size_t local_2f8;
  undefined1 local_2f0 [352];
  ConfidentialTxIn local_190;
  
  if ((long)(this->vin_).
            super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->vin_).
            super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x15ffffffea0) {
    local_2f0._0_8_ = "cfdcore_elements_transaction.cpp";
    local_2f0._8_4_ = 0x613;
    local_2f0._16_8_ = "AddTxIn";
    logger::log<>((CfdSourceLocation *)local_2f0,kCfdLogLevelWarning,"vin maximum.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2f0._0_8_ = local_2f0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"txin maximum.","");
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_2f0);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  tx = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  local_300 = txid;
  Txid::GetData((ByteData *)local_2f0,txid);
  ByteData::GetBytes(&local_318,(ByteData *)local_2f0);
  if ((_func_int **)local_2f0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ - local_2f0._0_8_);
  }
  bVar3 = Script::IsEmpty(unlocking_script);
  if (bVar3) {
    local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    Script::GetData((ByteData *)local_2f0,unlocking_script);
    ByteData::GetBytes(&local_338,(ByteData *)local_2f0);
    if ((_func_int **)local_2f0._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ - local_2f0._0_8_);
    }
  }
  local_33c = wally_tx_add_elements_raw_input
                        (tx,local_318.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                         (long)local_318.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_318.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,index,sequence,
                         local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (long)local_338.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_338.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                         (wally_tx_witness_stack *)0x0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,
                         (uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(wally_tx_witness_stack *)0x0,
                         0);
  if (local_33c != 0) {
    local_2f0._0_8_ = "cfdcore_elements_transaction.cpp";
    local_2f0._8_4_ = 0x623;
    local_2f0._16_8_ = "AddTxIn";
    logger::log<int&>((CfdSourceLocation *)local_2f0,kCfdLogLevelWarning,
                      "wally_tx_add_elements_raw_input NG[{}].",&local_33c);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2f0._0_8_ = local_2f0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"txin add error.","");
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_2f0);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_2f8 = 0;
  wally_tx_is_coinbase(tx,&local_2f8);
  txid_00 = local_300;
  index_00 = index & 0x3fffffff;
  if (local_2f8 != 0) {
    index_00 = index;
  }
  ConfidentialTxIn::ConfidentialTxIn((ConfidentialTxIn *)local_2f0,local_300,index_00,sequence);
  bVar3 = Script::IsEmpty(unlocking_script);
  if (!bVar3) {
    ConfidentialTxIn::ConfidentialTxIn(&local_190,txid_00,index_00,sequence,unlocking_script);
    ConfidentialTxIn::operator=((ConfidentialTxIn *)local_2f0,&local_190);
    ConfidentialTxIn::~ConfidentialTxIn(&local_190);
  }
  ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
  push_back(&this->vin_,(value_type *)local_2f0);
  pCVar1 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)local_2f0);
  if (local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_318.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_318.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_318.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (int)((ulong)((long)pCVar2 - (long)pCVar1) >> 5) * -0x45d1745d - 1;
}

Assistant:

uint32_t ConfidentialTransaction::AddTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script) {
  if (vin_.size() == std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "vin maximum.");
    throw CfdException(kCfdIllegalStateError, "txin maximum.");
  }

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  const std::vector<uint8_t> &txid_buf = txid.GetData().GetBytes();
  std::vector<uint8_t> empty_data;
  const std::vector<uint8_t> &script_data =
      (unlocking_script.IsEmpty()) ? empty_data
                                   : unlocking_script.GetData().GetBytes();
  int ret = wally_tx_add_elements_raw_input(
      tx_pointer, txid_buf.data(), txid_buf.size(), index, sequence,
      script_data.data(), script_data.size(), NULL, NULL, 0, NULL, 0, NULL, 0,
      NULL, 0, NULL, 0, NULL, 0, NULL, 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_elements_raw_input NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "txin add error.");
  }

  size_t is_coinbase = 0;
  wally_tx_is_coinbase(tx_pointer, &is_coinbase);
  uint32_t set_index = (is_coinbase == 0) ? index & kTxInVoutMask : index;
  ConfidentialTxIn txin(txid, set_index, sequence);
  if (!unlocking_script.IsEmpty()) {
    txin = ConfidentialTxIn(txid, set_index, sequence, unlocking_script);
  }
  vin_.push_back(txin);
  return static_cast<uint32_t>(vin_.size() - 1);
}